

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsLineItem::setPen(QGraphicsLineItem *this,QPen *pen)

{
  char cVar1;
  QRectF *this_00;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_QGraphicsItem).d_ptr.d[1].childrenBoundingRect;
  cVar1 = QPen::operator==((QPen *)this_00,pen);
  if (cVar1 == '\0') {
    QGraphicsItem::prepareGeometryChange(&this->super_QGraphicsItem);
    QPen::operator=((QPen *)this_00,pen);
    local_48.w = 0.0;
    local_48.h = 0.0;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    QGraphicsItem::update(&this->super_QGraphicsItem,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsLineItem::setPen(const QPen &pen)
{
    Q_D(QGraphicsLineItem);
    if (d->pen == pen)
        return;
    prepareGeometryChange();
    d->pen = pen;
    update();
}